

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void terminate(void)

{
  _GLFWmonitor *monitor_00;
  _GLFWerror *__ptr;
  _GLFWerror *error;
  _GLFWmonitor *monitor;
  int i;
  
  memset(&_glfw.callbacks,0,0x10);
  while (_glfw.windowListHead != (_GLFWwindow *)0x0) {
    glfwDestroyWindow((GLFWwindow *)_glfw.windowListHead);
  }
  while (_glfw.cursorListHead != (_GLFWcursor *)0x0) {
    glfwDestroyCursor((GLFWcursor *)_glfw.cursorListHead);
  }
  for (monitor._4_4_ = 0; monitor._4_4_ < _glfw.monitorCount; monitor._4_4_ = monitor._4_4_ + 1) {
    monitor_00 = _glfw.monitors[monitor._4_4_];
    if ((monitor_00->originalRamp).size != 0) {
      _glfwPlatformSetGammaRamp(monitor_00,&monitor_00->originalRamp);
    }
    _glfwFreeMonitor(monitor_00);
  }
  free(_glfw.monitors);
  _glfw.monitors = (_GLFWmonitor **)0x0;
  _glfw.monitorCount = 0;
  free(_glfw.mappings);
  _glfw.mappings = (_GLFWmapping *)0x0;
  _glfw.mappingCount = 0;
  _glfwTerminateVulkan();
  _glfwPlatformTerminateJoysticks();
  _glfwPlatformTerminate();
  _glfw.initialized = 0;
  while (__ptr = _glfw.errorListHead, _glfw.errorListHead != (_GLFWerror *)0x0) {
    _glfw.errorListHead = (_glfw.errorListHead)->next;
    free(__ptr);
  }
  _glfwPlatformDestroyTls(&_glfw.contextSlot);
  _glfwPlatformDestroyTls(&_glfw.errorSlot);
  _glfwPlatformDestroyMutex(&_glfw.errorLock);
  memset(&_glfw,0,0x21458);
  return;
}

Assistant:

static void terminate(void)
{
    int i;

    memset(&_glfw.callbacks, 0, sizeof(_glfw.callbacks));

    while (_glfw.windowListHead)
        glfwDestroyWindow((GLFWwindow*) _glfw.windowListHead);

    while (_glfw.cursorListHead)
        glfwDestroyCursor((GLFWcursor*) _glfw.cursorListHead);

    for (i = 0;  i < _glfw.monitorCount;  i++)
    {
        _GLFWmonitor* monitor = _glfw.monitors[i];
        if (monitor->originalRamp.size)
            _glfwPlatformSetGammaRamp(monitor, &monitor->originalRamp);
        _glfwFreeMonitor(monitor);
    }

    free(_glfw.monitors);
    _glfw.monitors = NULL;
    _glfw.monitorCount = 0;

    free(_glfw.mappings);
    _glfw.mappings = NULL;
    _glfw.mappingCount = 0;

    _glfwTerminateVulkan();
    _glfwPlatformTerminateJoysticks();
    _glfwPlatformTerminate();

    _glfw.initialized = GLFW_FALSE;

    while (_glfw.errorListHead)
    {
        _GLFWerror* error = _glfw.errorListHead;
        _glfw.errorListHead = error->next;
        free(error);
    }

    _glfwPlatformDestroyTls(&_glfw.contextSlot);
    _glfwPlatformDestroyTls(&_glfw.errorSlot);
    _glfwPlatformDestroyMutex(&_glfw.errorLock);

    memset(&_glfw, 0, sizeof(_glfw));
}